

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LennardJonesAdapter.cpp
# Opt level: O2

void __thiscall
OpenMD::LennardJonesAdapter::makeLennardJones
          (LennardJonesAdapter *this,RealType sigma,RealType epsilon,bool isSoft)

{
  AtomType *this_00;
  bool bVar1;
  undefined1 local_58 [40];
  RealType local_30;
  RealType local_28;
  ulong local_20;
  
  bVar1 = isLennardJones(this);
  if (bVar1) {
    AtomType::removeProperty(this->at_,(string *)LJtypeID_abi_cxx11_);
  }
  local_20 = (ulong)isSoft;
  this_00 = this->at_;
  local_30 = sigma;
  local_28 = epsilon;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::LJAtypeParameters>,std::__cxx11::string_const&,OpenMD::LJAtypeParameters&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (LJAtypeParameters *)LJtypeID_abi_cxx11_);
  local_58._16_8_ = local_58._0_8_;
  local_58._24_8_ = local_58._8_8_;
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = 0;
  AtomType::addProperty(this_00,(shared_ptr<OpenMD::GenericData> *)(local_58 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  return;
}

Assistant:

void LennardJonesAdapter::makeLennardJones(RealType sigma, RealType epsilon,
                                             bool isSoft) {
    if (isLennardJones()) { at_->removeProperty(LJtypeID); }

    LJAtypeParameters ljParam {};
    ljParam.epsilon = epsilon;
    ljParam.sigma   = sigma;
    ljParam.isSoft  = isSoft;

    at_->addProperty(std::make_shared<LJAtypeData>(LJtypeID, ljParam));
  }